

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maybe.hpp
# Opt level: O0

maybe<pstore::command_line::option_*,_void> * __thiscall
pstore::maybe<pstore::command_line::option*,void>::operator=
          (maybe<pstore::command_line::option*,void> *this,option **other)

{
  option **__a;
  option *local_20;
  option *temp;
  option **other_local;
  maybe<pstore::command_line::option_*,_void> *this_local;
  
  if (((byte)*this & 1) == 0) {
    *(option **)(this + 8) = *other;
    *this = (maybe<pstore::command_line::option*,void>)0x1;
  }
  else {
    local_20 = *other;
    temp = (option *)other;
    other_local = (option **)this;
    __a = maybe<pstore::command_line::option_*,_void>::value
                    ((maybe<pstore::command_line::option_*,_void> *)this);
    std::swap<pstore::command_line::option*>(__a,&local_20);
  }
  return (maybe<pstore::command_line::option_*,_void> *)this;
}

Assistant:

maybe & operator= (U && other) noexcept (
            std::is_nothrow_copy_assignable<T>::value && std::is_nothrow_copy_constructible<
                T>::value && std::is_nothrow_move_assignable<T>::value &&
                std::is_nothrow_move_constructible<T>::value) {

            if (valid_) {
                T temp = std::forward<U> (other);
                std::swap (this->value (), temp);
            } else {
                new (&storage_) T (std::forward<U> (other));
                valid_ = true;
            }
            return *this;
        }